

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  uint64_t uVar1;
  BCPos BVar2;
  uint uVar3;
  GCfunc *fn_00;
  BCIns *ip_00;
  char *pcVar4;
  long lVar5;
  BCReg local_58;
  BCReg slot;
  MMS mm;
  BCIns *ip;
  GCproto *pt;
  BCPos pc;
  GCfunc *fn;
  cTValue *pframe;
  char **name_local;
  cTValue *frame_local;
  lua_State *L_local;
  
  if (frame <= (cTValue *)((L->stack).ptr64 + 8)) {
    return (char *)0x0;
  }
  name_local = (char **)frame;
  if ((frame->u64 & 7) == 3) {
    name_local = (char **)((long)frame - (frame->u64 & 0xfffffffffffffff8));
  }
  if (((ulong)*name_local & 3) == 0) {
    lVar5 = (ulong)((*(uint *)(*name_local + -4) >> 8 & 0xff) + 2) * -8;
  }
  else {
    lVar5 = -((ulong)*name_local & 0xfffffffffffffff8);
  }
  fn_00 = (GCfunc *)(*(ulong *)((long)name_local + lVar5 + -8) & 0x7fffffffffff);
  BVar2 = debug_framepc(L,fn_00,(cTValue *)name_local);
  if (BVar2 != 0xffffffff) {
    uVar1 = (fn_00->c).pc.ptr64;
    ip_00 = (BCIns *)(uVar1 + (ulong)BVar2 * 4);
    uVar3 = (int)(uint)lj_bc_mode[*ip_00 & 0xff] >> 0xb;
    if (uVar3 == 9) {
      local_58 = *ip_00 >> 8 & 0xff;
      if ((*ip_00 & 0xff) == 0x45) {
        local_58 = local_58 - 3;
      }
      pcVar4 = lj_debug_slotname((GCproto *)(uVar1 - 0x68),ip_00,local_58,name);
      return pcVar4;
    }
    if (uVar3 != 0x16) {
      *name = (char *)(*(long *)((L->glref).ptr64 + 0x1a8 + (ulong)uVar3 * 8) + 0x18);
      L_local = (lua_State *)anon_var_dwarf_119e6;
      return (char *)L_local;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}